

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# video_writer.c
# Opt level: O2

void aom_video_writer_close(AvxVideoWriter *writer)

{
  if (writer != (AvxVideoWriter *)0x0) {
    rewind((FILE *)writer->file);
    write_header(writer->file,&writer->info,writer->frame_count);
    fclose((FILE *)writer->file);
    free(writer);
    return;
  }
  return;
}

Assistant:

void aom_video_writer_close(AvxVideoWriter *writer) {
  if (writer) {
    // Rewriting frame header with real frame count
    rewind(writer->file);
    write_header(writer->file, &writer->info, writer->frame_count);

    fclose(writer->file);
    free(writer);
  }
}